

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrototypeChainCache.cpp
# Opt level: O3

void __thiscall
Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::Clear
          (ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *this,
          bool isThreadClear)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->registration !=
      (ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> **)0x0) {
    if (this->cache == (PrototypeChainCache<Js::NoSpecialPropertyCache> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/PrototypeChainCache.cpp"
                                  ,0x5c,"(this->cache)","this->cache");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    if (this->scriptContext->isFinalized == false) {
      PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(this->cache);
    }
    if (!isThreadClear) {
      DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*,_RealCount>
      ::RemoveElement<Memory::ArenaAllocator>
                (&this->threadRegistry->scriptRegistrations,&this->threadRegistry->arena,
                 this->registration);
    }
    this->registration =
         (ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> **)0x0;
  }
  return;
}

Assistant:

void
ScriptCacheRegistry<T>::Clear(bool isThreadClear)
{
    if (this->registration != nullptr)
    {
        Assert(this->cache);
        if (!this->scriptContext->IsFinalized())
        {
            // If ScriptContext is finalized, then cache may be freed so we shouldn't clear it
            this->cache->Clear();
        }
        // Thread clear will reset the registry, so we don't need to call unregister
        if (!isThreadClear)
        {
            this->threadRegistry->Unregister(this->registration);
        }
        this->registration = nullptr;
    }
}